

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

BaseNode * __thiscall
asmjit::v1_14::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  long lVar1;
  bool bVar2;
  long *in_RDX;
  BaseNode *in_RSI;
  long in_RDI;
  BaseNode *next;
  BaseNode *prev;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  
  if (*(long *)in_RSI != 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  if (*(long *)(in_RSI + 8) != 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  bVar2 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                    ((NodeFlags)in_RSI[0x11],kIsActive);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  bVar2 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                    (*(NodeFlags *)((long)in_RDX + 0x11),kIsActive);
  if (!bVar2) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  lVar1 = *in_RDX;
  *(long *)in_RSI = lVar1;
  *(long **)(in_RSI + 8) = in_RDX;
  in_RSI[0x11] = (BaseNode)((byte)in_RSI[0x11] | 0x80);
  if (in_RSI[0x10] == (BaseNode)0x2) {
    *(undefined1 *)(in_RDI + 0x1b1) = 1;
  }
  *in_RDX = (long)in_RSI;
  if (lVar1 == 0) {
    *(BaseNode **)(in_RDI + 0x1a0) = in_RSI;
  }
  else {
    *(BaseNode **)(lVar1 + 8) = in_RSI;
  }
  return in_RSI;
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _nodeList._first = node;

  return node;
}